

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

void __thiscall
tchecker::clock_updates_visitor_t::visit
          (clock_updates_visitor_t *this,typed_int_to_clock_assign_statement_t *stmt)

{
  bool bVar1;
  typed_lvalue_expression_t *ptVar2;
  undefined1 local_68 [16];
  shared_ptr<const_tchecker::expression_t> local_58 [2];
  undefined1 local_38 [16];
  shared_ptr<const_tchecker::expression_t> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  typed_int_to_clock_assign_statement_t *stmt_local;
  clock_updates_visitor_t *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  stmt_local = (typed_int_to_clock_assign_statement_t *)this;
  bVar1 = in_loop(this);
  if (bVar1) {
    ptVar2 = (typed_lvalue_expression_t *)
             typed_int_to_clock_assign_statement_t::clock
                       ((typed_int_to_clock_assign_statement_t *)local_18._M_pi);
    typed_int_to_clock_assign_statement_t::value_ptr
              ((typed_int_to_clock_assign_statement_t *)local_38);
    std::shared_ptr<tchecker::expression_t_const>::
    shared_ptr<tchecker::typed_expression_t_const,void>
              ((shared_ptr<tchecker::expression_t_const> *)&local_28,
               (shared_ptr<const_tchecker::typed_expression_t> *)local_38);
    update_int_to_clock_inside_loop(this,ptVar2,&local_28);
    std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(&local_28);
    std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
              ((shared_ptr<const_tchecker::typed_expression_t> *)local_38);
  }
  else {
    ptVar2 = (typed_lvalue_expression_t *)
             typed_int_to_clock_assign_statement_t::clock
                       ((typed_int_to_clock_assign_statement_t *)local_18._M_pi);
    typed_int_to_clock_assign_statement_t::value_ptr
              ((typed_int_to_clock_assign_statement_t *)local_68);
    std::shared_ptr<tchecker::expression_t_const>::
    shared_ptr<tchecker::typed_expression_t_const,void>
              ((shared_ptr<tchecker::expression_t_const> *)local_58,
               (shared_ptr<const_tchecker::typed_expression_t> *)local_68);
    update_int_to_clock_outside_loop(this,ptVar2,local_58);
    std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(local_58);
    std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
              ((shared_ptr<const_tchecker::typed_expression_t> *)local_68);
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_int_to_clock_assign_statement_t const & stmt)
  {
    if (in_loop())
      update_int_to_clock_inside_loop(stmt.clock(), stmt.value_ptr());
    else
      update_int_to_clock_outside_loop(stmt.clock(), stmt.value_ptr());
  }